

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray * __thiscall
QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString>::toLatin1
          (QByteArray *__return_storage_ptr__,
          QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString> *this)

{
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
            (&local_30,(QStringBuilder<QString_&,_QLatin1String> *)this);
  QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray toLatin1() const { return this->resolved().toLatin1(); }